

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash-stringify-walker.cpp
# Opt level: O1

size_t __thiscall wasm::StringifyHasher::operator()(StringifyHasher *this,Expression *curr)

{
  Id IVar1;
  Id IVar2;
  size_t sVar3;
  size_t unaff_R14;
  
  IVar1 = curr->_id;
  if ((0x35 < (ulong)IVar1) || ((0x3000000000000eU >> ((ulong)IVar1 & 0x3f) & 1) == 0)) {
    sVar3 = ExpressionAnalyzer::shallowHash(curr);
    return sVar3;
  }
  if (IVar1 == IfId) {
    IVar2 = curr->_id;
    sVar3 = ExpressionAnalyzer::hash((Expression *)curr[1].type.id);
    unaff_R14 = (ulong)(IVar2 >> 4) + 0x9e3779b97f4a7c15 + (ulong)IVar2 * 0x1000 + sVar3 ^
                (ulong)IVar2;
    if (*(Expression **)(curr + 2) != (Expression *)0x0) {
      sVar3 = ExpressionAnalyzer::hash(*(Expression **)(curr + 2));
      unaff_R14 = unaff_R14 ^ (unaff_R14 >> 4) + sVar3 + unaff_R14 * 0x1000 + -0x61c8864680b583eb;
    }
  }
  if (IVar1 == IfId) {
    return unaff_R14;
  }
  sVar3 = ExpressionAnalyzer::hash(curr);
  return sVar3;
}

Assistant:

size_t StringifyHasher::operator()(Expression* curr) const {
  if (Properties::isControlFlowStructure(curr)) {
    if (auto* iff = curr->dynCast<If>()) {
      size_t digest = wasm::hash(iff->_id);
      rehash(digest, ExpressionAnalyzer::hash(iff->ifTrue));
      if (iff->ifFalse) {
        rehash(digest, ExpressionAnalyzer::hash(iff->ifFalse));
      }
      return digest;
    }

    return ExpressionAnalyzer::hash(curr);
  }

  return ExpressionAnalyzer::shallowHash(curr);
}